

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_java_struct_reader(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  ostream *poVar2;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,
                           "public void read(org.apache.thrift.protocol.TProtocol iprot) throws org.apache.thrift.TException {"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"scheme(iprot).read(iprot, this);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_reader(ostream& out, t_struct* tstruct) {
  (void)tstruct;
  indent(out) << "public void read(org.apache.thrift.protocol.TProtocol iprot) throws "
                 "org.apache.thrift.TException {" << endl;
  indent_up();
  indent(out) << "scheme(iprot).read(iprot, this);" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}